

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O3

astcenc_error astcenc_get_block_info(astcenc_context *ctxo,uint8_t *data,astcenc_block_info *info)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  block_size_descriptor *pbVar5;
  undefined1 auVar6 [16];
  float afVar7 [4];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  uint uVar21;
  bool bVar22;
  uint uVar23;
  long lVar24;
  vint4 *pvVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  bool a_hdr;
  symbolic_compressed_block scb;
  int weight_plane1 [216];
  int weight_plane2 [216];
  bool local_8c9;
  decimation_info *local_8c8;
  block_mode *local_8c0;
  partition_info *local_8b8;
  block_size_descriptor *local_8b0;
  float (*local_8a8) [2] [4];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 local_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 local_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined2 local_840;
  undefined2 uStack_83e;
  undefined2 uStack_83c;
  undefined2 uStack_83a;
  undefined2 uStack_838;
  undefined2 uStack_836;
  undefined2 uStack_834;
  undefined2 uStack_832;
  undefined4 local_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined4 local_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 local_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  undefined4 local_7d0;
  undefined4 uStack_7cc;
  undefined4 uStack_7c8;
  undefined4 uStack_7c4;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 local_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  symbolic_compressed_block local_7a0;
  vint4 local_720;
  vint4 local_710 [53];
  bool local_3c0 [912];
  
  auVar36 = in_ZMM5._0_32_;
  physical_to_symbolic((ctxo->context).bsd,data,&local_7a0);
  pbVar5 = (ctxo->context).bsd;
  memset(info,0,0x860);
  info->profile = (ctxo->context).config.profile;
  uVar21 = (ctxo->context).config.block_y;
  info->block_x = (ctxo->context).config.block_x;
  info->block_y = uVar21;
  info->block_z = (ctxo->context).config.block_z;
  info->texel_count = (uint)pbVar5->texel_count;
  info->is_error_block = local_7a0.block_type == 0;
  if ((local_7a0.block_type != 0) &&
     (info->is_constant_block = local_7a0.block_type < 3, local_7a0.block_type >= 3)) {
    local_8b8 = block_size_descriptor::get_partition_info
                          (pbVar5,(uint)local_7a0.partition_count,(uint)local_7a0.partition_index);
    uVar3 = pbVar5->block_mode_packed_index[local_7a0.block_mode];
    if ((uVar3 == 0xffff) ||
       (pbVar5->block_mode_count_all < (uint)uVar3 || pbVar5->block_mode_count_all == (uint)uVar3))
    {
      __assert_fail("packed_index != BLOCK_BAD_BLOCK_MODE && packed_index < this->block_mode_count_all"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_internal.h"
                    ,0x27f,
                    "const block_mode &block_size_descriptor::get_block_mode(unsigned int) const");
    }
    local_8c0 = pbVar5->block_modes + uVar3;
    bVar2 = pbVar5->block_modes[uVar3].decimation_mode;
    uVar4._0_1_ = pbVar5->decimation_tables[bVar2].weight_x;
    uVar4._1_1_ = pbVar5->decimation_tables[bVar2].weight_y;
    auVar6 = vpmovzxbd_avx(ZEXT216(uVar4));
    info->weight_x = (int)auVar6._0_8_;
    info->weight_y = (int)((ulong)auVar6._0_8_ >> 0x20);
    info->weight_z = (uint)pbVar5->decimation_tables[bVar2].weight_z;
    info->is_dual_plane_block = (bool)(pbVar5->block_modes[uVar3].field_0x5 & 1);
    info->partition_count = (uint)local_7a0.partition_count;
    info->partition_index = (uint)local_7a0.partition_index;
    info->dual_plane_component = (int)local_7a0.plane2_component;
    uVar23 = 0;
    uVar21 = 0;
    if ((ulong)local_7a0.quant_mode < 0x15) {
      uVar21 = *(uint *)(&DAT_003266d4 + (ulong)local_7a0.quant_mode * 4);
    }
    info->color_level_count = uVar21;
    uVar27 = (ulong)pbVar5->block_modes[uVar3].quant_mode;
    if (uVar27 < 0x15) {
      uVar23 = *(uint *)(&DAT_003266d4 + uVar27 * 4);
    }
    local_8c8 = pbVar5->decimation_tables + bVar2;
    info->weight_level_count = uVar23;
    local_8b0 = pbVar5;
    if (local_7a0.partition_count != 0) {
      local_8a8 = info->color_endpoints;
      uVar27 = 0;
      local_7b0 = 0x9e;
      uStack_7ac = 0x9e;
      uStack_7a8 = 0x9e;
      uStack_7a4 = 0x9e;
      local_7c0 = 0x20;
      uStack_7bc = 0x20;
      uStack_7b8 = 0x20;
      uStack_7b4 = 0x20;
      local_7d0 = 0xffff;
      uStack_7cc = 0xffff;
      uStack_7c8 = 0xffff;
      uStack_7c4 = 0xffff;
      local_7e0 = 0x7ffffc00;
      uStack_7dc = 0x7ffffc00;
      uStack_7d8 = 0x7ffffc00;
      uStack_7d4 = 0x7ffffc00;
      local_7f0 = 0x7ff;
      uStack_7ec = 0x7ff;
      uStack_7e8 = 0x7ff;
      uStack_7e4 = 0x7ff;
      local_800 = 0x1ff;
      uStack_7fc = 0x1ff;
      uStack_7f8 = 0x1ff;
      uStack_7f4 = 0x1ff;
      local_840 = 5;
      uStack_83e = 5;
      uStack_83c = 5;
      uStack_83a = 5;
      uStack_838 = 5;
      uStack_836 = 5;
      uStack_834 = 5;
      uStack_832 = 5;
      local_850 = 0xfffff800;
      uStack_84c = 0xfffff800;
      uStack_848 = 0xfffff800;
      uStack_844 = 0xfffff800;
      local_860 = 0x7bff;
      uStack_85c = 0x7bff;
      uStack_858 = 0x7bff;
      uStack_854 = 0x7bff;
      local_870 = 0x38000000;
      uStack_86c = 0x38000000;
      uStack_868 = 0x38000000;
      uStack_864 = 0x38000000;
      local_880 = 0x3ff;
      uStack_87c = 0x3ff;
      uStack_878 = 0x3ff;
      uStack_874 = 0x3ff;
      local_890 = 0x7800;
      uStack_88c = 0x7800;
      uStack_888 = 0x7800;
      uStack_884 = 0x7800;
      local_8a0 = 0x3c00;
      uStack_89c = 0x3c00;
      uStack_898 = 0x3c00;
      uStack_894 = 0x3c00;
      local_810 = 3;
      uStack_80c = 3;
      uStack_808 = 3;
      uStack_804 = 3;
      local_820 = 0x5ff;
      uStack_81c = 0x5ff;
      uStack_818 = 0x5ff;
      uStack_814 = 0x5ff;
      local_830 = 0xfffffe00;
      uStack_82c = 0xfffffe00;
      uStack_828 = 0xfffffe00;
      uStack_824 = 0xfffffe00;
      do {
        unpack_color_endpoints
                  ((ctxo->context).config.profile,(uint)local_7a0.color_formats[uVar27],
                   local_7a0.color_formats + uVar27 * 8 + 0xc,local_3c0,&local_8c9,&local_720,
                   local_710);
        auVar6._4_4_ = uStack_82c;
        auVar6._0_4_ = local_830;
        auVar6._8_4_ = uStack_828;
        auVar6._12_4_ = uStack_824;
        auVar17._4_4_ = uStack_81c;
        auVar17._0_4_ = local_820;
        auVar17._8_4_ = uStack_818;
        auVar17._12_4_ = uStack_814;
        auVar18._4_4_ = uStack_80c;
        auVar18._0_4_ = local_810;
        auVar18._8_4_ = uStack_808;
        auVar18._12_4_ = uStack_804;
        info->color_endpoint_modes[uVar27] = (uint)local_7a0.color_formats[uVar27];
        bVar22 = local_8c9;
        if (((info->is_hdr_block | local_3c0[0]) & 1U) != 0) {
          bVar22 = true;
        }
        info->is_hdr_block = bVar22;
        uVar21 = -(local_3c0[0] & 1);
        auVar28 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
        auVar28 = vpinsrd_avx(auVar28,uVar21,2);
        auVar28 = vpinsrd_avx(auVar28,-(uint)local_8c9,3);
        lVar24 = 0;
        auVar16._2_2_ = uStack_83e;
        auVar16._0_2_ = local_840;
        auVar16._4_2_ = uStack_83c;
        auVar16._6_2_ = uStack_83a;
        auVar16._8_2_ = uStack_838;
        auVar16._10_2_ = uStack_836;
        auVar16._12_2_ = uStack_834;
        auVar16._14_2_ = uStack_832;
        auVar15._4_4_ = uStack_84c;
        auVar15._0_4_ = local_850;
        auVar15._8_4_ = uStack_848;
        auVar15._12_4_ = uStack_844;
        auVar14._4_4_ = uStack_85c;
        auVar14._0_4_ = local_860;
        auVar14._8_4_ = uStack_858;
        auVar14._12_4_ = uStack_854;
        auVar13._4_4_ = uStack_86c;
        auVar13._0_4_ = local_870;
        auVar13._8_4_ = uStack_868;
        auVar13._12_4_ = uStack_864;
        auVar12._4_4_ = uStack_87c;
        auVar12._0_4_ = local_880;
        auVar12._8_4_ = uStack_878;
        auVar12._12_4_ = uStack_874;
        auVar11._4_4_ = uStack_88c;
        auVar11._0_4_ = local_890;
        auVar11._8_4_ = uStack_888;
        auVar11._12_4_ = uStack_884;
        auVar10._4_4_ = uStack_89c;
        auVar10._0_4_ = local_8a0;
        auVar10._8_4_ = uStack_898;
        auVar10._12_4_ = uStack_894;
        pvVar25 = &local_720;
        bVar22 = true;
        do {
          bVar20 = bVar22;
          auVar1 = *(undefined1 (*) [16])pvVar25->m;
          auVar31._4_4_ = uStack_7ec;
          auVar31._0_4_ = local_7f0;
          auVar31._8_4_ = uStack_7e8;
          auVar31._12_4_ = uStack_7e4;
          auVar29 = vpand_avx(auVar1,auVar31);
          auVar33 = vpcmpgtd_avx(auVar29,auVar17);
          auVar31 = vpslld_avx(auVar29,2);
          auVar31 = vpaddd_avx(auVar6,auVar31);
          auVar32 = vpmaddwd_avx(auVar29,auVar16);
          auVar32 = vpaddd_avx(auVar32,auVar15);
          auVar31 = vblendvps_avx(auVar31,auVar32,auVar33);
          auVar32 = vpsrld_avx(auVar1,8);
          auVar32 = vpandn_avx(auVar32,auVar1);
          auVar32 = vcvtdq2ps_avx(auVar32);
          auVar32 = vpsrld_avx(auVar32,0x17);
          auVar19._4_4_ = uStack_7ac;
          auVar19._0_4_ = local_7b0;
          auVar19._8_4_ = uStack_7a8;
          auVar19._12_4_ = uStack_7a4;
          auVar32 = vpsubd_avx(auVar19,auVar32);
          auVar32 = vpmaxsd_avx(auVar32,_DAT_00277060);
          auVar33._4_4_ = uStack_7bc;
          auVar33._0_4_ = local_7c0;
          auVar33._8_4_ = uStack_7b8;
          auVar33._12_4_ = uStack_7b4;
          auVar33 = vpminsd_avx(auVar32,auVar33);
          auVar32._4_4_ = uStack_7fc;
          auVar32._0_4_ = local_800;
          auVar32._8_4_ = uStack_7f8;
          auVar32._12_4_ = uStack_7f4;
          auVar32 = vpcmpgtd_avx(auVar29,auVar32);
          auVar29 = vpmaddwd_avx(auVar18,auVar29);
          auVar31 = vblendvps_avx(auVar29,auVar31,auVar32);
          auVar29._4_4_ = uStack_7cc;
          auVar29._0_4_ = local_7d0;
          auVar29._8_4_ = uStack_7c8;
          auVar29._12_4_ = uStack_7c4;
          auVar29 = vpcmpeqd_avx(auVar1,auVar29);
          auVar32 = vpslld_avx(auVar33,0x17);
          auVar32 = vpaddd_avx(auVar13,auVar32);
          auVar35._0_4_ = (int)auVar32._0_4_;
          auVar35._4_4_ = (int)auVar32._4_4_;
          auVar35._8_4_ = (int)auVar32._8_4_;
          auVar35._12_4_ = (int)auVar32._12_4_;
          auVar32 = vpmulld_avx(auVar35,auVar1);
          auVar32 = vpsrld_avx(auVar32,6);
          auVar32 = vpand_avx(auVar12,auVar32);
          auVar33 = vpslld_avx(auVar33,10);
          auVar32 = vpsubd_avx(auVar32,auVar33);
          auVar32 = vpaddd_avx(auVar11,auVar32);
          auVar32 = vblendvps_avx(auVar32,auVar10,auVar29);
          auVar29 = vpcmpgtd_avx(auVar1,auVar18);
          auVar33 = vpslld_avx(auVar1,8);
          auVar36 = ZEXT1632(auVar33);
          auVar32 = vblendvps_avx(auVar33,auVar32,auVar29);
          auVar29 = vpsrld_avx(auVar1,1);
          auVar1._4_4_ = uStack_7dc;
          auVar1._0_4_ = local_7e0;
          auVar1._8_4_ = uStack_7d8;
          auVar1._12_4_ = uStack_7d4;
          auVar1 = vpand_avx(auVar29,auVar1);
          auVar31 = vpsrld_avx(auVar31,3);
          auVar1 = vpor_avx(auVar31,auVar1);
          auVar1 = vpminud_avx(auVar1,auVar14);
          auVar1 = vpblendvb_avx(auVar32,auVar1,auVar28);
          auVar1 = vpackssdw_avx(auVar1,auVar1);
          afVar7 = (float  [4])vcvtph2ps_f16c(auVar1);
          local_8a8[uVar27][lVar24] = afVar7;
          lVar24 = 1;
          pvVar25 = local_710;
          bVar22 = false;
        } while (bVar20);
        uVar27 = uVar27 + 1;
      } while (uVar27 < local_7a0.partition_count);
    }
    pbVar5 = local_8b0;
    unpack_weights(local_8b0,&local_7a0,local_8c8,(bool)(local_8c0->field_0x5 & 1),(int *)&local_720
                   ,(int *)local_3c0);
    bVar2 = pbVar5->texel_count;
    uVar27 = (ulong)bVar2;
    if (uVar27 != 0) {
      lVar24 = uVar27 - 1;
      auVar34._8_8_ = lVar24;
      auVar34._0_8_ = lVar24;
      auVar34._16_8_ = lVar24;
      auVar34._24_8_ = lVar24;
      bVar22 = info->is_dual_plane_block;
      auVar28[1] = 0;
      auVar28[0] = bVar22;
      auVar28[2] = bVar22;
      auVar28[3] = 0;
      auVar28[4] = bVar22;
      auVar28[5] = 0;
      auVar28[6] = bVar22;
      auVar28[7] = 0;
      auVar28[8] = bVar22;
      auVar28[9] = 0;
      auVar28[10] = bVar22;
      auVar28[0xb] = 0;
      auVar28[0xc] = bVar22;
      auVar28[0xd] = 0;
      auVar28[0xe] = bVar22;
      auVar28[0xf] = 0;
      uVar26 = 0;
      auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar30._8_8_ = 0x8000000000000000;
      auVar30._0_8_ = 0x8000000000000000;
      auVar30._16_8_ = 0x8000000000000000;
      auVar30._24_8_ = 0x8000000000000000;
      auVar36 = vpcmpeqd_avx2(auVar36,auVar36);
      do {
        auVar37._8_8_ = uVar26;
        auVar37._0_8_ = uVar26;
        auVar37._16_8_ = uVar26;
        auVar37._24_8_ = uVar26;
        auVar38 = vpor_avx2(auVar37,auVar8);
        auVar37 = vpor_avx2(auVar37,auVar9);
        auVar37 = vpcmpgtq_avx2(auVar37 ^ auVar30,auVar34 ^ auVar30);
        auVar38 = vpcmpgtq_avx2(auVar38 ^ auVar30,auVar34 ^ auVar30);
        auVar37 = vpackssdw_avx2(auVar38,auVar37);
        auVar6 = vpackssdw_avx(SUB3216(auVar37 ^ auVar36,0),SUB3216(auVar37 ^ auVar36,0x10));
        auVar6 = vpshufd_avx(auVar6,0xd8);
        auVar37 = vpmovzxwd_avx2(auVar6);
        auVar39 = vpslld_avx2(auVar37,0x1f);
        auVar37 = vpmaskmovd_avx2(auVar39,*(undefined1 (*) [32])((long)local_720.m + uVar26 * 4));
        auVar37 = vcvtdq2ps_avx(auVar37);
        auVar38._4_4_ = auVar37._4_4_ * 0.0625;
        auVar38._0_4_ = auVar37._0_4_ * 0.0625;
        auVar38._8_4_ = auVar37._8_4_ * 0.0625;
        auVar38._12_4_ = auVar37._12_4_ * 0.0625;
        auVar38._16_4_ = auVar37._16_4_ * 0.0625;
        auVar38._20_4_ = auVar37._20_4_ * 0.0625;
        auVar38._24_4_ = auVar37._24_4_ * 0.0625;
        auVar38._28_4_ = auVar37._28_4_;
        auVar37 = vmaskmovps_avx(auVar39,auVar38);
        *(undefined1 (*) [32])(info->weight_values_plane1 + uVar26) = auVar37;
        auVar6 = vpand_avx(auVar6,auVar28);
        auVar37 = vpmovzxwd_avx2(auVar6);
        auVar38 = vpslld_avx2(auVar37,0x1f);
        auVar37 = vpmaskmovd_avx2(auVar38,*(undefined1 (*) [32])(local_3c0 + uVar26 * 4));
        auVar37 = vcvtdq2ps_avx(auVar37);
        auVar39._4_4_ = auVar37._4_4_ * 0.0625;
        auVar39._0_4_ = auVar37._0_4_ * 0.0625;
        auVar39._8_4_ = auVar37._8_4_ * 0.0625;
        auVar39._12_4_ = auVar37._12_4_ * 0.0625;
        auVar39._16_4_ = auVar37._16_4_ * 0.0625;
        auVar39._20_4_ = auVar37._20_4_ * 0.0625;
        auVar39._24_4_ = auVar37._24_4_ * 0.0625;
        auVar39._28_4_ = auVar37._28_4_;
        auVar37 = vmaskmovps_avx(auVar38,auVar39);
        *(undefined1 (*) [32])(info->weight_values_plane2 + uVar26) = auVar37;
        uVar26 = uVar26 + 8;
      } while ((bVar2 + 7 & 0xfffffff8) != uVar26);
      if (uVar27 != 0) {
        uVar27 = 0;
        do {
          info->partition_assignment[uVar27] = local_8b8->partition_of_texel[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar27 < pbVar5->texel_count);
      }
    }
  }
  return ASTCENC_SUCCESS;
}

Assistant:

astcenc_error astcenc_get_block_info(
	astcenc_context* ctxo,
	const uint8_t data[16],
	astcenc_block_info* info
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	(void)data;
	(void)info;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;

	// Decode the compressed data into a symbolic form
	symbolic_compressed_block scb;
	physical_to_symbolic(*ctx->bsd, data, scb);

	// Fetch the appropriate partition and decimation tables
	block_size_descriptor& bsd = *ctx->bsd;

	// Start from a clean slate
	memset(info, 0, sizeof(*info));

	// Basic info we can always populate
	info->profile = ctx->config.profile;

	info->block_x = ctx->config.block_x;
	info->block_y = ctx->config.block_y;
	info->block_z = ctx->config.block_z;
	info->texel_count = bsd.texel_count;

	// Check for error blocks first
	info->is_error_block = scb.block_type == SYM_BTYPE_ERROR;
	if (info->is_error_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Check for constant color blocks second
	info->is_constant_block = scb.block_type == SYM_BTYPE_CONST_F16 ||
	                          scb.block_type == SYM_BTYPE_CONST_U16;
	if (info->is_constant_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Otherwise handle a full block ; known to be valid after conditions above have been checked
	int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	const block_mode& bm = bsd.get_block_mode(scb.block_mode);
	const decimation_info& di = bsd.get_decimation_info(bm.decimation_mode);

	info->weight_x = di.weight_x;
	info->weight_y = di.weight_y;
	info->weight_z = di.weight_z;

	info->is_dual_plane_block = bm.is_dual_plane != 0;

	info->partition_count = scb.partition_count;
	info->partition_index = scb.partition_index;
	info->dual_plane_component = scb.plane2_component;

	info->color_level_count = get_quant_level(scb.get_color_quant_mode());
	info->weight_level_count = get_quant_level(bm.get_weight_quant_mode());

	// Unpack color endpoints for each active partition
	for (unsigned int i = 0; i < scb.partition_count; i++)
	{
		bool rgb_hdr;
		bool a_hdr;
		vint4 endpnt[2];

		unpack_color_endpoints(ctx->config.profile,
		                       scb.color_formats[i],
		                       scb.color_values[i],
		                       rgb_hdr, a_hdr,
		                       endpnt[0], endpnt[1]);

		// Store the color endpoint mode info
		info->color_endpoint_modes[i] = scb.color_formats[i];
		info->is_hdr_block = info->is_hdr_block || rgb_hdr || a_hdr;

		// Store the unpacked and decoded color endpoint
		vmask4 hdr_mask(rgb_hdr, rgb_hdr, rgb_hdr, a_hdr);
		for (int j = 0; j < 2; j++)
		{
			vint4 color_lns = lns_to_sf16(endpnt[j]);
			vint4 color_unorm = unorm16_to_sf16(endpnt[j]);
			vint4 datai = select(color_unorm, color_lns, hdr_mask);
			store(float16_to_float(datai), info->color_endpoints[i][j]);
		}
	}

	// Unpack weights for each texel
	int weight_plane1[BLOCK_MAX_TEXELS];
	int weight_plane2[BLOCK_MAX_TEXELS];

	unpack_weights(bsd, scb, di, bm.is_dual_plane, weight_plane1, weight_plane2);
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->weight_values_plane1[i] = static_cast<float>(weight_plane1[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		if (info->is_dual_plane_block)
		{
			info->weight_values_plane2[i] = static_cast<float>(weight_plane2[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		}
	}

	// Unpack partition assignments for each texel
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->partition_assignment[i] = pi.partition_of_texel[i];
	}

	return ASTCENC_SUCCESS;
#endif
}